

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O3

void switch_tss_ra(CPUX86State *env,int tss_selector,uint32_t e1,uint32_t e2,int source,
                  uint32_t next_eip,uintptr_t retaddr)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  target_ulong tVar6;
  int iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t val;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  abi_ptr aVar21;
  SegmentCache *pSVar22;
  target_ulong *ptVar23;
  uint32_t *puVar24;
  uint32_t new_segs [6];
  uint32_t new_regs [8];
  uint local_b4;
  uint local_a0;
  uint32_t local_88;
  uint local_84;
  int local_80;
  int local_7c;
  undefined8 local_78;
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  
  uVar14 = e2 >> 8 & 0xf;
  if (uVar14 == 5) {
    if (-1 < (short)e2) goto LAB_00518fb3;
    tss_selector = e1 >> 0x10;
    if ((e1 >> 0x12 & 1) == 0) {
      uVar14 = tss_selector & 0xfffffff8;
      if ((tss_selector | 7U) <= (env->gdt).limit) {
        uVar17 = 2;
        uVar10 = 2;
        aVar21 = (ulong)uVar14 + (env->gdt).base;
        if (((env->hflags >> 0x17 & 1) != 0) && (uVar10 = 0, (~env->hflags & 3) != 0)) {
          uVar10 = (uint)env->eflags >> 0x11 & 2;
        }
        e1 = cpu_ldl_mmuidx_ra_x86_64(env,aVar21,uVar10,retaddr);
        if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
          uVar17 = (uint)env->eflags >> 0x11 & 2;
        }
        e2 = cpu_ldl_mmuidx_ra_x86_64(env,aVar21 + 4,uVar17,retaddr);
        if (((e2 >> 0xc & 1) == 0) && ((e2 & 0x700) == 0x100)) {
          uVar14 = e2 >> 8 & 0xf;
          goto LAB_00517e51;
        }
      }
      iVar7 = 0xd;
      goto LAB_00518ffd;
    }
    uVar14 = tss_selector & 0xfffffffc;
    goto LAB_00518ff3;
  }
LAB_00517e51:
  if (-1 < (short)e2) {
LAB_00518fb3:
    uVar14 = tss_selector & 0xfffc;
    iVar7 = 0xb;
    goto LAB_00518ffd;
  }
  iVar7 = 0x67;
  if (uVar14 < 8) {
    iVar7 = 0x2b;
  }
  uVar17 = e2 & 0xf0000 | e1 & 0xffff;
  uVar10 = uVar17 << 0xc | 0xfff;
  if ((e2 >> 0x17 & 1) == 0) {
    uVar10 = uVar17;
  }
  if (((tss_selector & 4U) == 0) && (iVar7 <= (int)uVar10)) {
    uVar17 = e1 >> 0x10;
    uVar18 = (e2 & 0xff) * 0x10000;
    uVar20 = e2 & 0xff000000;
    uVar16 = (ulong)(uVar20 + uVar17 | uVar18);
    local_60 = 0x67;
    if (((env->tr).flags & 0x800) == 0) {
      local_60 = 0x2b;
    }
    uVar13 = env->hflags;
    if (uVar14 < 8) {
      uVar12 = 2;
      uVar11 = 2;
      if (((uVar13 >> 0x17 & 1) != 0) && (uVar11 = 0, (~uVar13 & 3) != 0)) {
        uVar11 = (uint)env->eflags >> 0x11 & 2;
      }
      local_a0 = cpu_lduw_mmuidx_ra_x86_64(env,uVar16 + 0xe,uVar11,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar12 = 0, (~env->hflags & 3) != 0)) {
        uVar12 = (uint)env->eflags >> 0x11 & 2;
      }
      local_b4 = cpu_lduw_mmuidx_ra_x86_64(env,uVar16 + 0x10,uVar12,retaddr);
      uVar15 = (ulong)(uVar17 + uVar20 + uVar18);
      lVar19 = 0;
      do {
        uVar17 = 2;
        if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
          uVar17 = (uint)env->eflags >> 0x11 & 2;
        }
        uVar8 = cpu_lduw_mmuidx_ra_x86_64(env,uVar15 + 0x12 + lVar19,uVar17,retaddr);
        *(uint32_t *)((long)&local_58 + lVar19 * 2) = uVar8 | 0xffff0000;
        lVar19 = lVar19 + 2;
      } while (lVar19 != 0x10);
      lVar19 = 0;
      do {
        uVar17 = 2;
        if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
          uVar17 = (uint)env->eflags >> 0x11 & 2;
        }
        uVar8 = cpu_lduw_mmuidx_ra_x86_64(env,uVar15 + 0x22 + lVar19,uVar17,retaddr);
        *(uint32_t *)((long)&local_88 + lVar19) = uVar8;
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x10);
      uVar17 = 2;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
        uVar17 = (uint)env->eflags >> 0x11 & 2;
      }
      uVar9 = cpu_lduw_mmuidx_ra_x86_64(env,uVar16 + 0x2a,uVar17,retaddr);
      local_78 = 0;
      local_68 = 0;
    }
    else {
      uVar12 = 2;
      uVar11 = 2;
      if (((uVar13 >> 0x17 & 1) != 0) && (uVar11 = 0, (~uVar13 & 3) != 0)) {
        uVar11 = (uint)env->eflags >> 0x11 & 2;
      }
      uVar8 = cpu_ldl_mmuidx_ra_x86_64(env,uVar16 + 0x1c,uVar11,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar12 = 0, (~env->hflags & 3) != 0)) {
        uVar12 = (uint)env->eflags >> 0x11 & 2;
      }
      local_a0 = cpu_ldl_mmuidx_ra_x86_64(env,uVar16 + 0x20,uVar12,retaddr);
      uVar13 = 2;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
        uVar13 = (uint)env->eflags >> 0x11 & 2;
      }
      local_b4 = cpu_ldl_mmuidx_ra_x86_64(env,uVar16 + 0x24,uVar13,retaddr);
      uVar15 = (ulong)(uVar17 + uVar20 + uVar18);
      lVar19 = 0;
      do {
        uVar17 = 2;
        if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
          uVar17 = (uint)env->eflags >> 0x11 & 2;
        }
        uVar9 = cpu_ldl_mmuidx_ra_x86_64(env,uVar15 + 0x28 + lVar19,uVar17,retaddr);
        *(uint32_t *)((long)&local_58 + lVar19) = uVar9;
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x20);
      lVar19 = 0;
      do {
        uVar17 = 2;
        if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
          uVar17 = (uint)env->eflags >> 0x11 & 2;
        }
        uVar9 = cpu_lduw_mmuidx_ra_x86_64(env,uVar15 + 0x48 + lVar19,uVar17,retaddr);
        *(uint32_t *)((long)&local_88 + lVar19) = uVar9;
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x18);
      uVar18 = 2;
      uVar17 = 2;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
        uVar17 = (uint)env->eflags >> 0x11 & 2;
      }
      uVar9 = cpu_lduw_mmuidx_ra_x86_64(env,uVar16 + 0x60,uVar17,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
        uVar18 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_ldl_mmuidx_ra_x86_64(env,uVar16 + 100,uVar18,retaddr);
      local_68 = (ulong)uVar8;
    }
    uVar18 = 2;
    uVar17 = 2;
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
      uVar17 = (uint)env->eflags >> 0x11 & 2;
    }
    uVar8 = cpu_ldub_mmuidx_ra_x86_64(env,(env->tr).base,uVar17,retaddr);
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
      uVar18 = (uint)env->eflags >> 0x11 & 2;
    }
    val = cpu_ldub_mmuidx_ra_x86_64(env,(env->tr).base + local_60,uVar18,retaddr);
    uVar18 = 2;
    uVar17 = 2;
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
      uVar17 = (uint)env->eflags >> 0x11 & 2;
    }
    cpu_stb_mmuidx_ra_x86_64(env,(env->tr).base,uVar8,uVar17,retaddr);
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
      uVar18 = (uint)env->eflags >> 0x11 & 2;
    }
    cpu_stb_mmuidx_ra_x86_64(env,local_60 + (env->tr).base,val,uVar18,retaddr);
    if ((uint)source < 2) {
      aVar21 = (env->gdt).base + (ulong)((env->tr).selector & 0xfffffff8) + 4;
      uVar18 = 2;
      uVar17 = 2;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
        uVar17 = (uint)env->eflags >> 0x11 & 2;
      }
      uVar8 = cpu_ldl_mmuidx_ra_x86_64(env,aVar21,uVar17,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
        uVar18 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stl_mmuidx_ra_x86_64(env,aVar21,uVar8 & 0xfffffdff,uVar18,retaddr);
    }
    tVar6 = env->eflags;
    uVar8 = cpu_cc_compute_all_x86_64(env,env->cc_op);
    uVar18 = uVar8 | (uint)tVar6 & 0xfffff32a;
    uVar17 = uVar18 & 0xffffbfff;
    if (source != 1) {
      uVar17 = uVar18;
    }
    uVar17 = uVar17 | env->df & 0x400U;
    tVar6 = (env->tr).base;
    uVar18 = env->hflags;
    if (uVar14 < 8) {
      uVar13 = 2;
      uVar20 = 2;
      if (((uVar18 >> 0x17 & 1) != 0) && (uVar20 = 0, (~uVar18 & 3) != 0)) {
        uVar20 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stw_mmuidx_ra_x86_64(env,tVar6 + 0xe,next_eip,uVar20,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
        uVar13 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x10,uVar17,uVar13,retaddr);
      uVar18 = 2;
      uVar17 = 2;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
        uVar17 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x12,(uint32_t)env->regs[0],uVar17,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
        uVar18 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x14,(uint32_t)env->regs[1],uVar18,retaddr);
      uVar18 = 2;
      uVar17 = 2;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
        uVar17 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x16,(uint32_t)env->regs[2],uVar17,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
        uVar18 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x18,(uint32_t)env->regs[3],uVar18,retaddr);
      uVar18 = 2;
      uVar17 = 2;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
        uVar17 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x1a,(uint32_t)env->regs[4],uVar17,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
        uVar18 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x1c,(uint32_t)env->regs[5],uVar18,retaddr);
      uVar18 = 2;
      uVar17 = 2;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
        uVar17 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x1e,(uint32_t)env->regs[6],uVar17,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
        uVar18 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x20,(uint32_t)env->regs[7],uVar18,retaddr);
      pSVar22 = env->segs;
      lVar19 = 0x22;
      do {
        uVar17 = 2;
        if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
          uVar17 = (uint)env->eflags >> 0x11 & 2;
        }
        cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + lVar19,pSVar22->selector,uVar17,retaddr);
        lVar19 = lVar19 + 4;
        pSVar22 = pSVar22 + 1;
      } while (lVar19 != 0x32);
    }
    else {
      uVar13 = 2;
      uVar20 = 2;
      if (((uVar18 >> 0x17 & 1) != 0) && (uVar20 = 0, (~uVar18 & 3) != 0)) {
        uVar20 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stl_mmuidx_ra_x86_64(env,tVar6 + 0x20,next_eip,uVar20,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
        uVar13 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x24,uVar17,uVar13,retaddr);
      uVar18 = 2;
      uVar17 = 2;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
        uVar17 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x28,(uint32_t)env->regs[0],uVar17,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
        uVar18 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x2c,(uint32_t)env->regs[1],uVar18,retaddr);
      uVar18 = 2;
      uVar17 = 2;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
        uVar17 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x30,(uint32_t)env->regs[2],uVar17,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
        uVar18 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x34,(uint32_t)env->regs[3],uVar18,retaddr);
      uVar18 = 2;
      uVar17 = 2;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
        uVar17 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x38,(uint32_t)env->regs[4],uVar17,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
        uVar18 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x3c,(uint32_t)env->regs[5],uVar18,retaddr);
      uVar18 = 2;
      uVar17 = 2;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
        uVar17 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x40,(uint32_t)env->regs[6],uVar17,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
        uVar18 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x44,(uint32_t)env->regs[7],uVar18,retaddr);
      pSVar22 = env->segs;
      lVar19 = 0x48;
      do {
        uVar17 = 2;
        if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
          uVar17 = (uint)env->eflags >> 0x11 & 2;
        }
        cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + lVar19,pSVar22->selector,uVar17,retaddr);
        lVar19 = lVar19 + 4;
        pSVar22 = pSVar22 + 1;
      } while (lVar19 != 0x60);
    }
    if (source == 0) {
LAB_00518a53:
      uVar18 = 2;
      uVar17 = 2;
      aVar21 = (long)(int)(tss_selector & 0xfffffff8U | 4) + (env->gdt).base;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
        uVar17 = (uint)env->eflags >> 0x11 & 2;
      }
      uVar8 = cpu_ldl_mmuidx_ra_x86_64(env,aVar21,uVar17,retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
        uVar18 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stl_mmuidx_ra_x86_64(env,aVar21,uVar8 | 0x200,uVar18,retaddr);
    }
    else if (source == 2) {
      uVar17 = 2;
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar17 = 0, (~env->hflags & 3) != 0)) {
        uVar17 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_stw_mmuidx_ra_x86_64(env,uVar16,(env->tr).selector,uVar17,retaddr);
      local_b4 = local_b4 | 0x4000;
      goto LAB_00518a53;
    }
    uVar15 = env->cr[0];
    pbVar1 = (byte *)((long)&env->hflags + 1);
    *pbVar1 = *pbVar1 | 8;
    env->cr[0] = uVar15 | 8;
    (env->tr).selector = tss_selector;
    (env->tr).base = uVar16;
    (env->tr).limit = uVar10;
    (env->tr).flags = e2 & 0xfffffdff;
    if (uVar14 < 8) {
      uVar14 = 0x7300;
      uVar16 = 0xffffffffffff8cfd;
    }
    else {
      uVar14 = 0x277300;
      uVar16 = 0xffffffffffd88cfd;
      if ((int)uVar15 < 0) {
        cpu_x86_update_cr3_x86_64(env,local_68);
      }
    }
    env->eip = (ulong)local_a0;
    env->cc_src = (ulong)(local_b4 & 0x8d5);
    env->cc_op = 1;
    env->df = 1 - (local_b4 >> 9 & 2);
    env->eflags = (uVar16 & env->eflags) + (ulong)(uVar14 & local_b4) + 2;
    auVar2._8_4_ = (int)(local_58 >> 0x20);
    auVar2._0_8_ = local_58 & 0xffffffff;
    auVar2._12_4_ = 0;
    *(undefined1 (*) [16])env->regs = auVar2;
    auVar3._8_4_ = (int)(local_50 >> 0x20);
    auVar3._0_8_ = local_50 & 0xffffffff;
    auVar3._12_4_ = 0;
    *(undefined1 (*) [16])(env->regs + 2) = auVar3;
    auVar4._8_4_ = (int)(local_48 >> 0x20);
    auVar4._0_8_ = local_48 & 0xffffffff;
    auVar4._12_4_ = 0;
    *(undefined1 (*) [16])(env->regs + 4) = auVar4;
    auVar5._8_4_ = (int)(local_40 >> 0x20);
    auVar5._0_8_ = local_40 & 0xffffffff;
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])(env->regs + 6) = auVar5;
    if ((local_b4 >> 0x11 & 1) == 0) {
      ptVar23 = &env->segs[0].base;
      lVar19 = 0;
      do {
        ((SegmentCache *)(ptVar23 + -1))->selector = (&local_88)[lVar19];
        *ptVar23 = 0;
        ptVar23[1] = 0;
        if ((int)lVar19 == 2) {
          *(byte *)&env->hflags = (byte)env->hflags & 0xfc;
          cpu_sync_bndcs_hflags_x86_64(env);
        }
        else if ((int)lVar19 == 1) {
          env->hflags = env->hflags & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
        }
        uVar14 = env->hflags;
        uVar10 = env->segs[2].flags >> 0x11 & 0x20;
        if (-1 < (short)uVar14) {
          if ((((env->cr[0] & 1) == 0) || ((uVar14 & 0x10) == 0)) || ((env->eflags & 0x20000) != 0))
          {
            uVar10 = uVar10 | 0x40;
          }
          else {
            uVar10 = uVar10 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                                    env->segs[2].base != 0) << 6;
          }
        }
        uVar10 = uVar14 & 0xffffff9f | uVar10;
        env->hflags = uVar10;
        lVar19 = lVar19 + 1;
        ptVar23 = ptVar23 + 3;
      } while (lVar19 != 6);
    }
    else {
      puVar24 = &env->segs[0].flags;
      lVar19 = 0;
      do {
        uVar8 = (&local_88)[lVar19];
        ((SegmentCache *)(puVar24 + -5))->selector = (uint)(ushort)uVar8;
        *(ulong *)(puVar24 + -3) = (ulong)(ushort)uVar8 << 4;
        *(undefined8 *)(puVar24 + -1) = 0xf3000000ffff;
        if ((int)lVar19 == 2) {
          *(byte *)&env->hflags = (byte)env->hflags | 3;
          cpu_sync_bndcs_hflags_x86_64(env);
        }
        else if ((int)lVar19 == 1) {
          env->hflags = env->hflags & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
        }
        uVar14 = env->hflags;
        uVar10 = env->segs[2].flags >> 0x11 & 0x20;
        if (-1 < (short)uVar14) {
          if ((((env->cr[0] & 1) == 0) || ((uVar14 & 0x10) == 0)) || ((env->eflags & 0x20000) != 0))
          {
            uVar10 = uVar10 | 0x40;
          }
          else {
            uVar10 = uVar10 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                                    env->segs[2].base != 0) << 6;
          }
        }
        uVar10 = uVar14 & 0xffffff9f | uVar10;
        env->hflags = uVar10;
        lVar19 = lVar19 + 1;
        puVar24 = puVar24 + 6;
      } while (lVar19 != 6);
    }
    (env->ldt).selector = uVar9 & 0xfffffffb;
    (env->ldt).base = 0;
    (env->ldt).limit = 0;
    (env->ldt).flags = 0;
    tss_selector = uVar9;
    if ((uVar9 & 4) == 0) {
      uVar14 = uVar9 & 0xfff8;
      if (uVar14 == 0) {
LAB_00518ed9:
        if ((local_b4 >> 0x11 & 1) == 0) {
          uVar14 = local_84 & 3;
          tss_load_seg(env,1,local_84,uVar14,retaddr);
          tss_load_seg(env,2,local_80,uVar14,retaddr);
          tss_load_seg(env,0,local_88,uVar14,retaddr);
          tss_load_seg(env,3,local_7c,uVar14,retaddr);
          tss_load_seg(env,4,(int)local_78,uVar14,retaddr);
          tss_load_seg(env,5,local_78._4_4_,uVar14,retaddr);
        }
        if (local_a0 <= env->segs[1].limit) {
          if ((env->dr[7] & 0x55) == 0) {
            return;
          }
          cpu_x86_update_dr7_x86_64(env,(uint)env->dr[7] & 0xffffffaa);
          return;
        }
        iVar7 = 0xd;
        uVar14 = 0;
      }
      else {
        if ((uVar9 | 7) <= (env->gdt).limit) {
          uVar18 = 2;
          uVar17 = 2;
          aVar21 = (long)(int)(uVar9 & 0xfffffff8) + (env->gdt).base;
          if (((uVar10 >> 0x17 & 1) != 0) && (uVar17 = 0, (~uVar10 & 3) != 0)) {
            uVar17 = (uint)env->eflags >> 0x11 & 2;
          }
          uVar8 = cpu_ldl_mmuidx_ra_x86_64(env,aVar21,uVar17,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar18 = 0, (~env->hflags & 3) != 0)) {
            uVar18 = (uint)env->eflags >> 0x11 & 2;
          }
          uVar9 = cpu_ldl_mmuidx_ra_x86_64(env,aVar21 + 4,uVar18,retaddr);
          if (((uVar9 & 0x1f00) == 0x200) && ((short)uVar9 < 0)) {
            (env->ldt).base = (ulong)(uVar9 & 0xff000000 | uVar8 >> 0x10 | (uVar9 & 0xff) << 0x10);
            uVar10 = uVar9 & 0xf0000 | uVar8 & 0xffff;
            uVar14 = uVar10 << 0xc | 0xfff;
            if ((uVar9 >> 0x17 & 1) == 0) {
              uVar14 = uVar10;
            }
            (env->ldt).limit = uVar14;
            (env->ldt).flags = uVar9;
            goto LAB_00518ed9;
          }
        }
LAB_00518ff3:
        iVar7 = 10;
      }
      goto LAB_00518ffd;
    }
  }
  uVar14 = tss_selector & 0xfffc;
  iVar7 = 10;
LAB_00518ffd:
  raise_exception_err_ra_x86_64(env,iVar7,uVar14,retaddr);
}

Assistant:

static void switch_tss_ra(CPUX86State *env, int tss_selector,
                          uint32_t e1, uint32_t e2, int source,
                          uint32_t next_eip, uintptr_t retaddr)
{
    int tss_limit, tss_limit_max, type, old_tss_limit_max, old_type, v1, v2, i;
    target_ulong tss_base;
    uint32_t new_regs[8], new_segs[6];
    uint32_t new_eflags, new_eip, new_cr3, new_ldt, new_trap;
    uint32_t old_eflags, eflags_mask;
    SegmentCache *dt;
    int index;
    target_ulong ptr;

    type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
    LOG_PCALL("switch_tss: sel=0x%04x type=%d src=%d\n", tss_selector, type,
              source);

    /* if task gate, we read the TSS segment and we load it */
    if (type == 5) {
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, tss_selector & 0xfffc, retaddr);
        }
        tss_selector = e1 >> 16;
        if (tss_selector & 4) {
            raise_exception_err_ra(env, EXCP0A_TSS, tss_selector & 0xfffc, retaddr);
        }
        if (load_segment_ra(env, &e1, &e2, tss_selector, retaddr) != 0) {
            raise_exception_err_ra(env, EXCP0D_GPF, tss_selector & 0xfffc, retaddr);
        }
        if (e2 & DESC_S_MASK) {
            raise_exception_err_ra(env, EXCP0D_GPF, tss_selector & 0xfffc, retaddr);
        }
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
        if ((type & 7) != 1) {
            raise_exception_err_ra(env, EXCP0D_GPF, tss_selector & 0xfffc, retaddr);
        }
    }

    if (!(e2 & DESC_P_MASK)) {
        raise_exception_err_ra(env, EXCP0B_NOSEG, tss_selector & 0xfffc, retaddr);
    }

    if (type & 8) {
        tss_limit_max = 103;
    } else {
        tss_limit_max = 43;
    }
    tss_limit = get_seg_limit(e1, e2);
    tss_base = get_seg_base(e1, e2);
    if ((tss_selector & 4) != 0 ||
        tss_limit < tss_limit_max) {
        raise_exception_err_ra(env, EXCP0A_TSS, tss_selector & 0xfffc, retaddr);
    }
    old_type = (env->tr.flags >> DESC_TYPE_SHIFT) & 0xf;
    if (old_type & 8) {
        old_tss_limit_max = 103;
    } else {
        old_tss_limit_max = 43;
    }

    /* read all the registers from the new TSS */
    if (type & 8) {
        /* 32 bit */
        new_cr3 = cpu_ldl_kernel_ra(env, tss_base + 0x1c, retaddr);
        new_eip = cpu_ldl_kernel_ra(env, tss_base + 0x20, retaddr);
        new_eflags = cpu_ldl_kernel_ra(env, tss_base + 0x24, retaddr);
        for (i = 0; i < 8; i++) {
            new_regs[i] = cpu_ldl_kernel_ra(env, tss_base + (0x28 + i * 4),
                                            retaddr);
        }
        for (i = 0; i < 6; i++) {
            new_segs[i] = cpu_lduw_kernel_ra(env, tss_base + (0x48 + i * 4),
                                             retaddr);
        }
        new_ldt = cpu_lduw_kernel_ra(env, tss_base + 0x60, retaddr);
        new_trap = cpu_ldl_kernel_ra(env, tss_base + 0x64, retaddr);
    } else {
        /* 16 bit */
        new_cr3 = 0;
        new_eip = cpu_lduw_kernel_ra(env, tss_base + 0x0e, retaddr);
        new_eflags = cpu_lduw_kernel_ra(env, tss_base + 0x10, retaddr);
        for (i = 0; i < 8; i++) {
            new_regs[i] = cpu_lduw_kernel_ra(env, tss_base + (0x12 + i * 2),
                                             retaddr) | 0xffff0000;
        }
        for (i = 0; i < 4; i++) {
            new_segs[i] = cpu_lduw_kernel_ra(env, tss_base + (0x22 + i * 4),
                                             retaddr);
        }
        new_ldt = cpu_lduw_kernel_ra(env, tss_base + 0x2a, retaddr);
        new_segs[R_FS] = 0;
        new_segs[R_GS] = 0;
        new_trap = 0;
    }
    /* XXX: avoid a compiler warning, see
     http://support.amd.com/us/Processor_TechDocs/24593.pdf
     chapters 12.2.5 and 13.2.4 on how to implement TSS Trap bit */
    (void)new_trap;

    /* NOTE: we must avoid memory exceptions during the task switch,
       so we make dummy accesses before */
    /* XXX: it can still fail in some cases, so a bigger hack is
       necessary to valid the TLB after having done the accesses */

    v1 = cpu_ldub_kernel_ra(env, env->tr.base, retaddr);
    v2 = cpu_ldub_kernel_ra(env, env->tr.base + old_tss_limit_max, retaddr);
    cpu_stb_kernel_ra(env, env->tr.base, v1, retaddr);
    cpu_stb_kernel_ra(env, env->tr.base + old_tss_limit_max, v2, retaddr);

    /* clear busy bit (it is restartable) */
    if (source == SWITCH_TSS_JMP || source == SWITCH_TSS_IRET) {
        target_ulong ptr;
        uint32_t e2;

        ptr = env->gdt.base + (env->tr.selector & ~7);
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, retaddr);
        e2 &= ~DESC_TSS_BUSY_MASK;
        cpu_stl_kernel_ra(env, ptr + 4, e2, retaddr);
    }
    old_eflags = cpu_compute_eflags(env);
    if (source == SWITCH_TSS_IRET) {
        old_eflags &= ~NT_MASK;
    }

    /* save the current state in the old TSS */
    if (type & 8) {
        /* 32 bit */
        cpu_stl_kernel_ra(env, env->tr.base + 0x20, next_eip, retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + 0x24, old_eflags, retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 0 * 4), env->regs[R_EAX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 1 * 4), env->regs[R_ECX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 2 * 4), env->regs[R_EDX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 3 * 4), env->regs[R_EBX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 4 * 4), env->regs[R_ESP], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 5 * 4), env->regs[R_EBP], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 6 * 4), env->regs[R_ESI], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 7 * 4), env->regs[R_EDI], retaddr);
        for (i = 0; i < 6; i++) {
            cpu_stw_kernel_ra(env, env->tr.base + (0x48 + i * 4),
                              env->segs[i].selector, retaddr);
        }
    } else {
        /* 16 bit */
        cpu_stw_kernel_ra(env, env->tr.base + 0x0e, next_eip, retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + 0x10, old_eflags, retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 0 * 2), env->regs[R_EAX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 1 * 2), env->regs[R_ECX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 2 * 2), env->regs[R_EDX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 3 * 2), env->regs[R_EBX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 4 * 2), env->regs[R_ESP], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 5 * 2), env->regs[R_EBP], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 6 * 2), env->regs[R_ESI], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 7 * 2), env->regs[R_EDI], retaddr);
        for (i = 0; i < 4; i++) {
            cpu_stw_kernel_ra(env, env->tr.base + (0x22 + i * 4),
                              env->segs[i].selector, retaddr);
        }
    }

    /* now if an exception occurs, it will occurs in the next task
       context */

    if (source == SWITCH_TSS_CALL) {
        cpu_stw_kernel_ra(env, tss_base, env->tr.selector, retaddr);
        new_eflags |= NT_MASK;
    }

    /* set busy bit */
    if (source == SWITCH_TSS_JMP || source == SWITCH_TSS_CALL) {
        target_ulong ptr;
        uint32_t e2;

        ptr = env->gdt.base + (tss_selector & ~7);
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, retaddr);
        e2 |= DESC_TSS_BUSY_MASK;
        cpu_stl_kernel_ra(env, ptr + 4, e2, retaddr);
    }

    /* set the new CPU state */
    /* from this point, any exception which occurs can give problems */
    env->cr[0] |= CR0_TS_MASK;
    env->hflags |= HF_TS_MASK;
    env->tr.selector = tss_selector;
    env->tr.base = tss_base;
    env->tr.limit = tss_limit;
    env->tr.flags = e2 & ~DESC_TSS_BUSY_MASK;

    if ((type & 8) && (env->cr[0] & CR0_PG_MASK)) {
        cpu_x86_update_cr3(env, new_cr3);
    }

    /* load all registers without an exception, then reload them with
       possible exception */
    env->eip = new_eip;
    eflags_mask = TF_MASK | AC_MASK | ID_MASK |
        IF_MASK | IOPL_MASK | VM_MASK | RF_MASK | NT_MASK;
    if (!(type & 8)) {
        eflags_mask &= 0xffff;
    }
    cpu_load_eflags(env, new_eflags, eflags_mask);
    /* XXX: what to do in 16 bit case? */
    env->regs[R_EAX] = new_regs[0];
    env->regs[R_ECX] = new_regs[1];
    env->regs[R_EDX] = new_regs[2];
    env->regs[R_EBX] = new_regs[3];
    env->regs[R_ESP] = new_regs[4];
    env->regs[R_EBP] = new_regs[5];
    env->regs[R_ESI] = new_regs[6];
    env->regs[R_EDI] = new_regs[7];
    if (new_eflags & VM_MASK) {
        for (i = 0; i < 6; i++) {
            load_seg_vm(env, i, new_segs[i]);
        }
    } else {
        /* first just selectors as the rest may trigger exceptions */
        for (i = 0; i < 6; i++) {
            cpu_x86_load_seg_cache(env, i, new_segs[i], 0, 0, 0);
        }
    }

    env->ldt.selector = new_ldt & ~4;
    env->ldt.base = 0;
    env->ldt.limit = 0;
    env->ldt.flags = 0;

    /* load the LDT */
    if (new_ldt & 4) {
        raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
    }

    if ((new_ldt & 0xfffc) != 0) {
        dt = &env->gdt;
        index = new_ldt & ~7;
        if ((index + 7) > dt->limit) {
            raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
        }
        ptr = dt->base + index;
        e1 = cpu_ldl_kernel_ra(env, ptr, retaddr);
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, retaddr);
        if ((e2 & DESC_S_MASK) || ((e2 >> DESC_TYPE_SHIFT) & 0xf) != 2) {
            raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
        }
        load_seg_cache_raw_dt(&env->ldt, e1, e2);
    }

    /* load the segments */
    if (!(new_eflags & VM_MASK)) {
        int cpl = new_segs[R_CS] & 3;
        tss_load_seg(env, R_CS, new_segs[R_CS], cpl, retaddr);
        tss_load_seg(env, R_SS, new_segs[R_SS], cpl, retaddr);
        tss_load_seg(env, R_ES, new_segs[R_ES], cpl, retaddr);
        tss_load_seg(env, R_DS, new_segs[R_DS], cpl, retaddr);
        tss_load_seg(env, R_FS, new_segs[R_FS], cpl, retaddr);
        tss_load_seg(env, R_GS, new_segs[R_GS], cpl, retaddr);
    }

    /* check that env->eip is in the CS segment limits */
    if (new_eip > env->segs[R_CS].limit) {
        /* XXX: different exception if CALL? */
        raise_exception_err_ra(env, EXCP0D_GPF, 0, retaddr);
    }

    /* reset local breakpoints */
    if (env->dr[7] & DR7_LOCAL_BP_MASK) {
        cpu_x86_update_dr7(env, env->dr[7] & ~DR7_LOCAL_BP_MASK);
    }
}